

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

void __thiscall
wasm::IRBuilder::ChildPopper::ConstraintCollector::noteAnyI16ArrayReferenceType
          (ConstraintCollector *this,Expression **childp)

{
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  *this_00;
  AnyI16ArrayReference local_31;
  undefined1 local_30 [24];
  Expression **local_18;
  Expression **childp_local;
  ConstraintCollector *this_local;
  
  this_00 = this->children;
  local_30._0_8_ = childp;
  local_18 = childp;
  childp_local = (Expression **)this;
  std::
  variant<wasm::IRBuilder::ChildPopper::Subtype,wasm::IRBuilder::ChildPopper::AnyType,wasm::IRBuilder::ChildPopper::AnyReference,wasm::IRBuilder::ChildPopper::AnyTuple,wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  ::
  variant<wasm::IRBuilder::ChildPopper::AnyI16ArrayReference,void,void,wasm::IRBuilder::ChildPopper::AnyI16ArrayReference,void>
            ((variant<wasm::IRBuilder::ChildPopper::Subtype,wasm::IRBuilder::ChildPopper::AnyType,wasm::IRBuilder::ChildPopper::AnyReference,wasm::IRBuilder::ChildPopper::AnyTuple,wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
              *)(local_30 + 8),&local_31);
  std::
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::push_back(this_00,(value_type *)local_30);
  return;
}

Assistant:

void noteAnyI16ArrayReferenceType(Expression** childp) {
      children.push_back({childp, {AnyI16ArrayReference{}}});
    }